

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O1

void __thiscall Assimp::X3DExporter::Export_Node(X3DExporter *this,aiNode *pNode,size_t pTabLevel)

{
  size_type *psVar1;
  size_t pTabLevel_00;
  int iVar2;
  aiMetadataEntry *paVar3;
  aiVector3D pVector;
  aiVector3D pVector_00;
  size_t pTabLevel_01;
  undefined4 __x;
  aiQuaterniont<float> aVar4;
  bool bVar5;
  _Node *p_Var6;
  long *plVar7;
  undefined8 *puVar8;
  aiMetadata *paVar9;
  Logger *this_00;
  ulong *puVar10;
  size_type sVar11;
  long lVar12;
  undefined8 uVar13;
  char *pcVar14;
  aiString *pKey;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  float fVar18;
  float fVar19;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar20;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar21;
  float fVar22;
  aiVector3D translate;
  aiVector3D scale;
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_> attr_list;
  ulong *local_330;
  long local_328;
  ulong local_320;
  long lStack_318;
  uint local_30c;
  undefined8 local_308;
  undefined4 uStack_300;
  undefined4 uStack_2fc;
  long *local_2f0;
  undefined8 local_2e8;
  long local_2e0;
  undefined8 uStack_2d8;
  aiVector3t<float> local_2d0;
  aiVector3t<float> local_2c0;
  _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  local_2b0;
  float local_298;
  float local_294;
  long *local_290;
  undefined8 local_288;
  long local_280;
  undefined8 uStack_278;
  size_t local_270;
  ulong *local_268;
  long local_260;
  ulong local_258;
  long lStack_250;
  ulong *local_248;
  long local_240;
  ulong local_238;
  long lStack_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  string local_1a8 [2];
  ios_base local_158 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_2b0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_2b0;
  local_2b0._M_impl._M_node._M_size = 0;
  local_2b0._M_impl._M_node.super__List_node_base._M_prev =
       local_2b0._M_impl._M_node.super__List_node_base._M_next;
  bVar5 = CheckAndExport_Light(this,pNode,pTabLevel);
  if (bVar5) goto LAB_003654ce;
  if ((pNode->mName).length != 0) {
    local_1c8 = (undefined1  [8])&local_1b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"DEF","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,(pNode->mName).data,(allocator<char> *)&local_330);
    p_Var6 = std::__cxx11::
             list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
             ::_M_create_node<Assimp::X3DExporter::SAttribute>
                       ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)&local_2b0,(SAttribute *)local_1c8);
    std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
    local_2b0._M_impl._M_node._M_size = local_2b0._M_impl._M_node._M_size + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    if (local_1c8 != (undefined1  [8])&local_1b8) {
      operator_delete((void *)local_1c8,local_1b8._M_allocated_capacity + 1);
    }
  }
  if ((((((0.01 < ABS((pNode->mTransformation).a2)) || (0.01 < ABS((pNode->mTransformation).a3))) ||
        (0.01 < ABS((pNode->mTransformation).a4))) ||
       (((0.01 < ABS((pNode->mTransformation).b1) || (0.01 < ABS((pNode->mTransformation).b3))) ||
        ((0.01 < ABS((pNode->mTransformation).b4) ||
         ((0.01 < ABS((pNode->mTransformation).c1) || (0.01 < ABS((pNode->mTransformation).c2)))))))
       )) || (0.01 < ABS((pNode->mTransformation).c4))) ||
     (((0.01 < ABS((pNode->mTransformation).d1) || (0.01 < ABS((pNode->mTransformation).d2))) ||
      (0.01 < ABS((pNode->mTransformation).d3))))) {
    uVar15 = 0;
  }
  else {
    fVar18 = (pNode->mTransformation).a1;
    uVar15 = 0;
    if ((fVar18 <= 1.01) && (0.99 <= fVar18)) {
      fVar18 = (pNode->mTransformation).b2;
      if (1.01 < fVar18) {
LAB_00365572:
        uVar15 = 0;
      }
      else {
        uVar15 = 0;
        if (0.99 <= fVar18) {
          fVar18 = (pNode->mTransformation).c3;
          if (1.01 < fVar18) goto LAB_00365572;
          if (0.99 <= fVar18) {
            fVar18 = (pNode->mTransformation).d4;
            if (fVar18 <= 1.01) {
              uVar15 = (uint)(0.99 <= fVar18);
            }
            else {
              uVar15 = 0;
            }
          }
        }
      }
    }
  }
  local_30c = uVar15;
  local_270 = pTabLevel;
  if ((char)uVar15 == '\0') {
    local_2c0.x = 0.0;
    local_2c0.y = 0.0;
    local_2c0.z = 0.0;
    local_2d0.x = 0.0;
    local_2d0.y = 0.0;
    local_2d0.z = 0.0;
    _local_1c8 = ZEXT812(0x3f800000);
    fStack_1bc = 0.0;
    aiMatrix4x4t<float>::Decompose
              (&pNode->mTransformation,&local_2c0,(aiQuaterniont<float> *)local_1c8,&local_2d0);
    fVar18 = (float)local_1c8._0_4_ * (float)local_1c8._0_4_ +
             fStack_1bc * fStack_1bc +
             (float)local_1c8._4_4_ * (float)local_1c8._4_4_ + fStack_1c0 * fStack_1c0;
    if (fVar18 < 0.0) {
      fVar18 = sqrtf(fVar18);
    }
    else {
      fVar18 = SQRT(fVar18);
    }
    aVar4 = _local_1c8;
    if ((fVar18 != 0.0) || (NAN(fVar18))) {
      fVar18 = 1.0 / fVar18;
      local_1c8._4_4_ = (float)local_1c8._4_4_ * fVar18;
      fStack_1c0 = aVar4.y;
      fStack_1bc = aVar4.z;
      fStack_1c0 = fStack_1c0 * fVar18;
      fStack_1bc = fStack_1bc * fVar18;
      local_1c8._0_4_ = fVar18 * (float)local_1c8._0_4_;
    }
    __x = local_1c8._0_4_;
    fVar18 = 1.0 - (float)local_1c8._0_4_ * (float)local_1c8._0_4_;
    if (fVar18 < 0.0) {
      fVar18 = sqrtf(fVar18);
      uVar20 = extraout_XMM0_Db;
      uStack_300 = extraout_XMM0_Dc;
      uStack_2fc = extraout_XMM0_Dd;
    }
    else {
      fVar18 = SQRT(fVar18);
      uVar20 = 0;
      uStack_300 = 0;
      uStack_2fc = 0;
    }
    local_308 = CONCAT44(uVar20,fVar18);
    fVar18 = acosf((float)__x);
    fVar18 = fVar18 + fVar18;
    if ((fVar18 != 0.0) || (NAN(fVar18))) {
      local_294 = (float)(~-(uint)(ABS((float)local_308) < 0.01) & (uint)(float)local_308 |
                         -(uint)(ABS((float)local_308) < 0.01) & 0x3f800000);
      fVar22 = (float)local_1c8._4_4_ / local_294;
      fVar21 = fStack_1c0 / local_294;
      local_294 = fStack_1bc / local_294;
      fVar19 = local_294 * local_294 + fVar22 * fVar22 + fVar21 * fVar21;
      local_308 = CONCAT44(local_308._4_4_,fVar22);
      local_298 = fVar18;
      if (fVar19 < 0.0) {
        fVar19 = sqrtf(fVar19);
      }
      else {
        fVar19 = SQRT(fVar19);
      }
      if (0.0 < fVar19) {
        local_1c8 = (undefined1  [8])&local_1b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"rotation","");
        __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                  (&local_50,vsnprintf,0x3a,"%f",(double)(float)local_308);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
        puVar10 = (ulong *)(plVar7 + 2);
        if ((ulong *)*plVar7 == puVar10) {
          local_258 = *puVar10;
          lStack_250 = plVar7[3];
          local_268 = &local_258;
        }
        else {
          local_258 = *puVar10;
          local_268 = (ulong *)*plVar7;
        }
        local_260 = plVar7[1];
        *plVar7 = (long)puVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                  (&local_1e8,vsnprintf,0x3a,"%f",(double)fVar21);
        uVar16 = 0xf;
        if (local_268 != &local_258) {
          uVar16 = local_258;
        }
        if (uVar16 < local_1e8._M_string_length + local_260) {
          uVar13 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            uVar13 = local_1e8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar13 < local_1e8._M_string_length + local_260) goto LAB_00364a22;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_1e8,0,(char *)0x0,(ulong)local_268);
        }
        else {
LAB_00364a22:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_268,(ulong)local_1e8._M_dataplus._M_p);
        }
        local_290 = &local_280;
        plVar7 = puVar8 + 2;
        if ((long *)*puVar8 == plVar7) {
          local_280 = *plVar7;
          uStack_278 = puVar8[3];
        }
        else {
          local_280 = *plVar7;
          local_290 = (long *)*puVar8;
        }
        local_288 = puVar8[1];
        *puVar8 = plVar7;
        puVar8[1] = 0;
        *(undefined1 *)plVar7 = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_290);
        puVar10 = (ulong *)(plVar7 + 2);
        if ((ulong *)*plVar7 == puVar10) {
          local_238 = *puVar10;
          lStack_230 = plVar7[3];
          local_248 = &local_238;
        }
        else {
          local_238 = *puVar10;
          local_248 = (ulong *)*plVar7;
        }
        local_240 = plVar7[1];
        *plVar7 = (long)puVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                  (&local_208,vsnprintf,0x3a,"%f",(double)local_294);
        uVar16 = 0xf;
        if (local_248 != &local_238) {
          uVar16 = local_238;
        }
        if (uVar16 < local_208._M_string_length + local_240) {
          uVar13 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            uVar13 = local_208.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar13 < local_208._M_string_length + local_240) goto LAB_00364b88;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,(ulong)local_248);
        }
        else {
LAB_00364b88:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_248,(ulong)local_208._M_dataplus._M_p);
        }
        local_2f0 = &local_2e0;
        plVar7 = puVar8 + 2;
        if ((long *)*puVar8 == plVar7) {
          local_2e0 = *plVar7;
          uStack_2d8 = puVar8[3];
        }
        else {
          local_2e0 = *plVar7;
          local_2f0 = (long *)*puVar8;
        }
        local_2e8 = puVar8[1];
        *puVar8 = plVar7;
        puVar8[1] = 0;
        *(undefined1 *)plVar7 = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_2f0);
        puVar10 = (ulong *)(plVar7 + 2);
        if ((ulong *)*plVar7 == puVar10) {
          local_320 = *puVar10;
          lStack_318 = plVar7[3];
          local_330 = &local_320;
        }
        else {
          local_320 = *puVar10;
          local_330 = (ulong *)*plVar7;
        }
        local_328 = plVar7[1];
        *plVar7 = (long)puVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                  (&local_228,vsnprintf,0x3a,"%f",(double)local_298);
        uVar16 = 0xf;
        if (local_330 != &local_320) {
          uVar16 = local_320;
        }
        if (uVar16 < local_228._M_string_length + local_328) {
          uVar13 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            uVar13 = local_228.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar13 < local_228._M_string_length + local_328) goto LAB_00364ccd;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,(ulong)local_330);
        }
        else {
LAB_00364ccd:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_330,(ulong)local_228._M_dataplus._M_p);
        }
        local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
        psVar1 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_1a8[0].field_2._0_8_ = *psVar1;
          local_1a8[0].field_2._8_8_ = puVar8[3];
        }
        else {
          local_1a8[0].field_2._0_8_ = *psVar1;
          local_1a8[0]._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_1a8[0]._M_string_length = puVar8[1];
        *puVar8 = psVar1;
        puVar8[1] = 0;
        *(undefined1 *)psVar1 = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        if (local_330 != &local_320) {
          operator_delete(local_330,local_320 + 1);
        }
        if (local_2f0 != &local_2e0) {
          operator_delete(local_2f0,local_2e0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        if (local_248 != &local_238) {
          operator_delete(local_248,local_238 + 1);
        }
        if (local_290 != &local_280) {
          operator_delete(local_290,local_280 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        if (local_268 != &local_258) {
          operator_delete(local_268,local_258 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (local_1a8[0]._M_string_length != 0) {
          sVar11 = 0;
          do {
            if (local_1a8[0]._M_dataplus._M_p[sVar11] == ',') {
              local_1a8[0]._M_dataplus._M_p[sVar11] = '.';
            }
            sVar11 = sVar11 + 1;
          } while (local_1a8[0]._M_string_length != sVar11);
        }
        p_Var6 = std::__cxx11::
                 list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                 ::_M_create_node<Assimp::X3DExporter::SAttribute>
                           ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                             *)&local_2b0,(SAttribute *)local_1c8);
        std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
        local_2b0._M_impl._M_node._M_size = local_2b0._M_impl._M_node._M_size + 1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        uVar15 = local_30c;
        if (local_1c8 != (undefined1  [8])&local_1b8) {
          operator_delete((void *)local_1c8,local_1b8._M_allocated_capacity + 1);
          uVar15 = local_30c;
        }
      }
    }
    if (((1e-06 < ABS(local_2c0.x + -1.0)) || (1e-06 < ABS(local_2c0.y + -1.0))) ||
       (1e-06 < ABS(local_2c0.z + -1.0))) {
      local_1c8 = (undefined1  [8])&local_1b8;
      pcVar14 = "scale";
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"scale","");
      pVector_00.y = local_2c0.y;
      pVector_00.x = local_2c0.x;
      pVector_00.z = local_2c0.z;
      Export_Node(aiNode_const*,unsigned_long)::$_1::operator()[abi_cxx11_
                (local_1a8,pcVar14,pVector_00);
      p_Var6 = std::__cxx11::
               list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
               ::_M_create_node<Assimp::X3DExporter::SAttribute>
                         ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                           *)&local_2b0,(SAttribute *)local_1c8);
      std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
      local_2b0._M_impl._M_node._M_size = local_2b0._M_impl._M_node._M_size + 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if (local_1c8 != (undefined1  [8])&local_1b8) {
        operator_delete((void *)local_1c8,local_1b8._M_allocated_capacity + 1);
      }
    }
    fVar18 = local_2d0.z * local_2d0.z + local_2d0.x * local_2d0.x + local_2d0.y * local_2d0.y;
    if (fVar18 < 0.0) {
      fVar18 = sqrtf(fVar18);
    }
    else {
      fVar18 = SQRT(fVar18);
    }
    if (0.0 < fVar18) {
      local_1c8 = (undefined1  [8])&local_1b8;
      pcVar14 = "translation";
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"translation","");
      pVector.y = local_2d0.y;
      pVector.x = local_2d0.x;
      pVector.z = local_2d0.z;
      Export_Node(aiNode_const*,unsigned_long)::$_1::operator()[abi_cxx11_
                (local_1a8,pcVar14,pVector);
      p_Var6 = std::__cxx11::
               list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
               ::_M_create_node<Assimp::X3DExporter::SAttribute>
                         ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                           *)&local_2b0,(SAttribute *)local_1c8);
      std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
      local_2b0._M_impl._M_node._M_size = local_2b0._M_impl._M_node._M_size + 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if (local_1c8 != (undefined1  [8])&local_1b8) {
        operator_delete((void *)local_1c8,local_1b8._M_allocated_capacity + 1);
      }
    }
    if ((char)uVar15 != '\0') goto LAB_00365105;
    local_1c8 = (undefined1  [8])&local_1b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"Transform","");
    NodeHelper_OpenNode(this,(string *)local_1c8,pTabLevel,false,
                        (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)&local_2b0);
  }
  else {
LAB_00365105:
    local_1c8 = (undefined1  [8])&local_1b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"Group","");
    NodeHelper_OpenNode(this,(string *)local_1c8,pTabLevel,false);
  }
  if (local_1c8 != (undefined1  [8])&local_1b8) {
    operator_delete((void *)local_1c8,local_1b8._M_allocated_capacity + 1);
  }
  if ((pNode->mMetaData != (aiMetadata *)0x0) &&
     (paVar9 = pNode->mMetaData, paVar9->mNumProperties != 0)) {
    local_308 = local_270 + 1;
    lVar17 = 8;
    lVar12 = 0;
    uVar16 = 0;
    do {
      paVar3 = paVar9->mValues;
      uVar15 = *(uint *)((long)paVar3 + lVar17 + -8);
      if (uVar15 < 6) {
        pKey = (aiString *)(paVar9->mKeys->data + lVar12 + -4);
        switch(uVar15) {
        case 0:
          Export_MetadataBoolean
                    (this,pKey,*(bool *)*(undefined8 *)((long)&paVar3->mType + lVar17),local_308);
          break;
        case 1:
          Export_MetadataInteger(this,pKey,**(int32_t **)((long)&paVar3->mType + lVar17),local_308);
          break;
        case 2:
          goto switchD_00365211_caseD_2;
        case 3:
          Export_MetadataFloat(this,pKey,**(float **)((long)&paVar3->mType + lVar17),local_308);
          break;
        case 4:
          Export_MetadataDouble(this,pKey,**(double **)((long)&paVar3->mType + lVar17),local_308);
          break;
        case 5:
          Export_MetadataString(this,pKey,*(aiString **)((long)&paVar3->mType + lVar17),local_308);
        }
      }
      else {
switchD_00365211_caseD_2:
        iVar2 = *(int *)((long)paVar3 + lVar17 + -8);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
        std::ostream::operator<<((ostringstream *)local_1c8,iVar2);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
        std::ios_base::~ios_base(local_158);
        plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_2f0,0,(char *)0x0,0x6cc714);
        local_330 = &local_320;
        puVar10 = (ulong *)(plVar7 + 2);
        if ((ulong *)*plVar7 == puVar10) {
          local_320 = *puVar10;
          lStack_318 = plVar7[3];
        }
        else {
          local_320 = *puVar10;
          local_330 = (ulong *)*plVar7;
        }
        local_328 = plVar7[1];
        *plVar7 = (long)puVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        this_00 = DefaultLogger::get();
        Logger::error(this_00,(char *)local_330);
        if (local_330 != &local_320) {
          operator_delete(local_330,local_320 + 1);
        }
        if (local_2f0 != &local_2e0) {
          operator_delete(local_2f0,local_2e0 + 1);
        }
      }
      uVar16 = uVar16 + 1;
      paVar9 = pNode->mMetaData;
      lVar12 = lVar12 + 0x404;
      lVar17 = lVar17 + 0x10;
    } while (uVar16 < paVar9->mNumProperties);
  }
  pTabLevel_01 = local_270;
  if (pNode->mNumMeshes != 0) {
    pTabLevel_00 = local_270 + 1;
    uVar16 = 0;
    do {
      Export_Mesh(this,(ulong)pNode->mMeshes[uVar16],pTabLevel_00);
      uVar16 = uVar16 + 1;
    } while (uVar16 < pNode->mNumMeshes);
  }
  if (pNode->mNumChildren != 0) {
    uVar16 = 0;
    do {
      Export_Node(this,pNode->mChildren[uVar16],pTabLevel_01 + 1);
      uVar16 = uVar16 + 1;
    } while (uVar16 < pNode->mNumChildren);
  }
  if ((char)local_30c == '\0') {
    local_1c8 = (undefined1  [8])&local_1b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"Transform","");
    NodeHelper_CloseNode(this,(string *)local_1c8,pTabLevel_01);
  }
  else {
    local_1c8 = (undefined1  [8])&local_1b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"Group","");
    NodeHelper_CloseNode(this,(string *)local_1c8,pTabLevel_01);
  }
  if (local_1c8 != (undefined1  [8])&local_1b8) {
    operator_delete((void *)local_1c8,local_1b8._M_allocated_capacity + 1);
  }
LAB_003654ce:
  std::__cxx11::
  _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
  _M_clear(&local_2b0);
  return;
}

Assistant:

void X3DExporter::Export_Node(const aiNode *pNode, const size_t pTabLevel)
{
bool transform = false;
list<SAttribute> attr_list;

	// In Assimp lights is stored in next way: light source store in mScene->mLights and in node tree must present aiNode with name same as
	// light source has. Considering it we must compare every aiNode name with light sources names. Why not to look where ligths is present
	// and save them to fili? Because corresponding aiNode can be already written to file and we can only add information to file not to edit.
	if(CheckAndExport_Light(*pNode, pTabLevel)) return;

	// Check if need DEF.
	if(pNode->mName.length) attr_list.push_back({"DEF", pNode->mName.C_Str()});

	// Check if need <Transformation> node against <Group>.
	if(!pNode->mTransformation.IsIdentity())
	{
		auto Vector2String = [this](const aiVector3D pVector) -> string
		{
			string tstr = to_string(pVector.x) + " " + to_string(pVector.y) + " " + to_string(pVector.z);

			AttrHelper_CommaToPoint(tstr);

			return tstr;
		};

		auto Rotation2String = [this](const aiVector3D pAxis, const ai_real pAngle) -> string
		{
			string tstr = to_string(pAxis.x) + " " + to_string(pAxis.y) + " " + to_string(pAxis.z) + " " + to_string(pAngle);

			AttrHelper_CommaToPoint(tstr);

			return tstr;
		};

		aiVector3D scale, translate, rotate_axis;
		ai_real rotate_angle;

		transform = true;
		pNode->mTransformation.Decompose(scale, rotate_axis, rotate_angle, translate);
		// Check if values different from default
		if((rotate_angle != 0) && (rotate_axis.Length() > 0))
			attr_list.push_back({"rotation", Rotation2String(rotate_axis, rotate_angle)});

        if(!scale.Equal({1.0,1.0,1.0})) {
            attr_list.push_back({"scale", Vector2String(scale)});
        }
        if(translate.Length() > 0) {
            attr_list.push_back({"translation", Vector2String(translate)});
        }
	}

	// Begin node if need.
	if(transform)
		NodeHelper_OpenNode("Transform", pTabLevel, false, attr_list);
	else
		NodeHelper_OpenNode("Group", pTabLevel);

	// Export metadata
	if(pNode->mMetaData != nullptr)
	{
		for(size_t idx_prop = 0; idx_prop < pNode->mMetaData->mNumProperties; idx_prop++)
		{
			const aiString* key;
			const aiMetadataEntry* entry;

			if(pNode->mMetaData->Get(idx_prop, key, entry))
			{
				switch(entry->mType)
				{
					case AI_BOOL:
						Export_MetadataBoolean(*key, *static_cast<bool*>(entry->mData), pTabLevel + 1);
						break;
					case AI_DOUBLE:
						Export_MetadataDouble(*key, *static_cast<double*>(entry->mData), pTabLevel + 1);
						break;
					case AI_FLOAT:
						Export_MetadataFloat(*key, *static_cast<float*>(entry->mData), pTabLevel + 1);
						break;
					case AI_INT32:
						Export_MetadataInteger(*key, *static_cast<int32_t*>(entry->mData), pTabLevel + 1);
						break;
					case AI_AISTRING:
						Export_MetadataString(*key, *static_cast<aiString*>(entry->mData), pTabLevel + 1);
						break;
					default:
						LogError("Unsupported metadata type: " + to_string(entry->mType));
						break;
				}// switch(entry->mType)
			}
		}
	}// if(pNode->mMetaData != nullptr)

	// Export meshes.
	for(size_t idx_mesh = 0; idx_mesh < pNode->mNumMeshes; idx_mesh++) Export_Mesh(pNode->mMeshes[idx_mesh], pTabLevel + 1);
	// Export children.
	for(size_t idx_node = 0; idx_node < pNode->mNumChildren; idx_node++) Export_Node(pNode->mChildren[idx_node], pTabLevel + 1);

	// End node if need.
	if(transform)
		NodeHelper_CloseNode("Transform", pTabLevel);
	else
		NodeHelper_CloseNode("Group", pTabLevel);
}